

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_info.cpp
# Opt level: O1

void __thiscall duckdb::AlterTableInfo::~AlterTableInfo(AlterTableInfo *this)

{
  pointer pcVar1;
  
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__AlterTableInfo_0247d2a8;
  pcVar1 = (this->super_AlterInfo).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_AlterInfo).name.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->super_AlterInfo).schema._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_AlterInfo).schema.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->super_AlterInfo).catalog._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_AlterInfo).catalog.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

AlterInfo::~AlterInfo() {
}